

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

Result<void> * __thiscall
ChainstateManager::PopulateAndValidateSnapshot
          (Result<void> *__return_storage_ptr__,ChainstateManager *this,
          Chainstate *snapshot_chainstate,AutoFile *coins_file,SnapshotMetadata *metadata)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  long lVar6;
  CChainParams *pCVar7;
  pointer ppCVar8;
  bool bVar9;
  CoinsCacheSizeState CVar10;
  CCoinsViewCache *this_00;
  CBlockIndex *pb;
  Chainstate *pCVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  size_t sVar14;
  AutoFile *args;
  long lVar15;
  char *__nbytes;
  pointer pAVar16;
  CBlockIndex *pa;
  undefined8 *puVar17;
  long *plVar18;
  long in_FS_OFFSET;
  byte bVar19;
  string_view logging_function;
  string_view logging_function_00;
  Span<unsigned_char> bytes;
  string_view source_file;
  string_view source_file_00;
  int64_t coins_processed;
  uint64_t coins_left;
  uint64_t coins_count;
  int base_height;
  CBlockIndex *snapshot_start_block;
  Wrapper<ScriptCompression,_CScript_&> local_780;
  uint8_t obj;
  undefined4 uStack_774;
  bool local_770;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  __native_type local_610 [5];
  optional<kernel::CCoinsStats> maybe_stats;
  long *local_468;
  long local_460;
  long local_458 [2];
  bilingual_str local_448 [2];
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  undefined1 *local_388;
  undefined8 local_380;
  undefined1 local_378;
  undefined7 uStack_377;
  undefined8 uStack_370;
  undefined1 *local_368;
  undefined8 local_360;
  undefined1 local_358;
  undefined7 uStack_357;
  undefined8 uStack_350;
  long *local_348;
  long local_340;
  long local_338 [2];
  bilingual_str local_328;
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  bilingual_str local_2c8;
  CBlockIndex *index;
  uchar auStack_280 [24];
  uint32_t local_268;
  long *local_258;
  long local_250;
  long local_248 [2];
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  undefined8 uStack_220;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  undefined8 uStack_200;
  Txid txid;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  undefined8 uStack_178;
  long *local_170;
  long local_168;
  long local_160 [2];
  bilingual_str local_150;
  undefined8 local_110 [10];
  undefined1 local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  bilingual_str local_98;
  uint256 base_blockhash;
  
  bVar19 = 0;
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = &cs_main;
  maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ =
       maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
       super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ & 0xffffffffffffff00;
  args = coins_file;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&maybe_stats);
  this_00 = Chainstate::CoinsTip(snapshot_chainstate);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&maybe_stats);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = &cs_main;
  maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ =
       maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
       super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&maybe_stats);
  pb = ::node::BlockManager::LookupBlockIndex(&this->m_blockman,&base_blockhash);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&maybe_stats);
  snapshot_start_block = pb;
  if (pb == (CBlockIndex *)0x0) {
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Did not find snapshot start blockheader %s","");
    puVar1 = (undefined1 *)
             ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                     super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10);
    maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
    super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&maybe_stats,local_b8,local_b0 + (long)local_b8);
    puVar2 = (undefined1 *)
             ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                     super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x30);
    maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
    super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ = puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                       super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x20),local_b8
               ,local_b0 + (long)local_b8);
    base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock55,&base_blockhash);
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)&maybe_stats,(bilingual_str *)&criticalblock55,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    puVar17 = (undefined8 *)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
    paVar3 = &local_98.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p == paVar3) {
      *puVar17 = CONCAT71(local_98.original.field_2._M_allocated_capacity._1_7_,
                          local_98.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
           local_98.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> =
           local_98.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(local_98.original.field_2._M_allocated_capacity._1_7_,
                    local_98.original.field_2._M_local_buf[0]);
    }
    paVar4 = &local_98.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
         local_98.original._M_string_length;
    local_98.original._M_string_length = 0;
    local_98.original.field_2._M_local_buf[0] = '\0';
    puVar17 = (undefined8 *)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.translated._M_dataplus._M_p == paVar4) {
      *puVar17 = CONCAT71(local_98.translated.field_2._M_allocated_capacity._1_7_,
                          local_98.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
           local_98.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
           local_98.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(local_98.translated.field_2._M_allocated_capacity._1_7_,
                    local_98.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
         local_98.translated._M_string_length;
    local_98.translated._M_string_length = 0;
    local_98.translated.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    local_98.original._M_dataplus._M_p = (pointer)paVar3;
    local_98.translated._M_dataplus._M_p = (pointer)paVar4;
    if ((__native_type *)criticalblock55.super_unique_lock._M_device != local_610) {
      operator_delete(criticalblock55.super_unique_lock._M_device,local_610[0].__align + 1);
    }
    if ((undefined1 *)
        maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
        super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ != puVar2) {
      operator_delete((void *)maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                              _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                              _M_payload._32_8_,
                      maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._M_value.
                      nTransactionOutputs + 1);
    }
    if ((undefined1 *)
        maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
        super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ != puVar1) {
      operator_delete((void *)maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                              _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                              _M_payload._0_8_,
                      maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._16_8_ + 1);
    }
    plVar18 = local_b8;
    if (local_b8 == local_a8) goto LAB_00405b8c;
  }
  else {
    iVar5 = pb->nHeight;
    pCVar7 = (this->m_options).chainparams;
    pAVar16 = (pCVar7->m_assumeutxo_data).
              super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
              super__Vector_impl_data._M_start;
LAB_00404ebb:
    base_height = iVar5;
    if (pAVar16 ==
        (pCVar7->m_assumeutxo_data).
        super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00404ecf;
    if (pAVar16->height != iVar5) goto code_r0x00404ec9;
    puVar17 = local_110;
    for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar17 = *(undefined8 *)pAVar16;
      pAVar16 = (pointer)((long)pAVar16 + ((ulong)bVar19 * -4 + 2) * 4);
      puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
    }
    local_c0 = 1;
    maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
    super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = &cs_main;
    maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
    super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ =
         maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
         super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&maybe_stats);
    pCVar11 = ActiveChainstate(this);
    ppCVar8 = (pCVar11->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar8 ==
        (pCVar11->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pa = (CBlockIndex *)0x0;
    }
    else {
      pa = ppCVar8[-1];
    }
    bVar9 = ::node::CBlockIndexWorkComparator::operator()
                      ((CBlockIndexWorkComparator *)&criticalblock55,pa,pb);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&maybe_stats);
    if (bVar9) {
      coins_left = metadata->m_coins_count;
      coins_count = coins_left;
      base_blob<256u>::ToString_abi_cxx11_((string *)&maybe_stats,&base_blockhash);
      logging_function._M_str = "PopulateAndValidateSnapshot";
      logging_function._M_len = 0x1b;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      __nbytes = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      LogPrintFormatInternal<unsigned_long,std::__cxx11::string>
                (logging_function,source_file,0x16ec,ALL,Info,(ConstevalFormatString<2U>)0x81008e,
                 &coins_left,(string *)&maybe_stats);
      if ((undefined1 *)
          maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
          super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ !=
          (undefined1 *)
          ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                  super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10)) {
        operator_delete((void *)maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                                _M_payload._0_8_,
                        maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                        .super__Optional_payload_base<kernel::CCoinsStats>._M_payload._16_8_ + 1);
      }
      coins_processed = 0;
      while (coins_left != 0) {
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        AutoFile::read(coins_file,(int)&txid,(void *)0x20,(size_t)__nbytes);
        uVar12 = ReadCompactSize<AutoFile>(coins_file,true);
        if (coins_left < uVar12) {
          local_258 = local_248;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,
                     "Mismatch in coins count in snapshot metadata and actual snapshot data","");
          local_238 = &local_228;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,local_258,local_250 + (long)local_258);
          local_218 = &local_208;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,local_258,local_250 + (long)local_258);
          puVar17 = (undefined8 *)
                    ((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
          if (local_238 == &local_228) {
            *puVar17 = CONCAT71(uStack_227,local_228);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                 uStack_220;
          }
          else {
            *(undefined1 **)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>
              .super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate> = local_238;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
                 CONCAT71(uStack_227,local_228);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_230;
          local_230 = 0;
          local_228 = 0;
          puVar17 = (undefined8 *)
                    ((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17;
          if (local_218 == &local_208) {
            *puVar17 = CONCAT71(uStack_207,local_208);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                 uStack_200;
          }
          else {
            *(undefined1 **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_218
            ;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
                 CONCAT71(uStack_207,local_208);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_210;
          local_210 = 0;
          local_208 = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
          local_a8[0] = local_248[0];
          plVar18 = local_258;
          local_238 = &local_228;
          local_218 = &local_208;
          if (local_258 == local_248) goto LAB_00405b8c;
          goto LAB_00405b84;
        }
        for (; uVar12 != 0; uVar12 = uVar12 - 1) {
          auStack_280[8] = '\0';
          auStack_280[9] = '\0';
          auStack_280[10] = '\0';
          auStack_280[0xb] = '\0';
          auStack_280[0xc] = '\0';
          auStack_280[0xd] = '\0';
          auStack_280[0xe] = '\0';
          auStack_280[0xf] = '\0';
          auStack_280[0x10] = '\0';
          auStack_280[0x11] = '\0';
          auStack_280[0x12] = '\0';
          auStack_280[0x13] = '\0';
          auStack_280[0x14] = '\0';
          auStack_280[0x15] = '\0';
          auStack_280[0x16] = '\0';
          auStack_280[0x17] = '\0';
          index = (CBlockIndex *)0x0;
          auStack_280[0] = '\0';
          auStack_280[1] = '\0';
          auStack_280[2] = '\0';
          auStack_280[3] = '\0';
          auStack_280[4] = '\0';
          auStack_280[5] = '\0';
          auStack_280[6] = '\0';
          auStack_280[7] = '\0';
          local_268 = 0xffffffff;
          CTxOut::CTxOut((CTxOut *)&criticalblock55);
          local_610[0]._24_4_ = 0;
          uVar13 = ReadCompactSize<AutoFile>(coins_file,true);
          local_268 = (uint32_t)uVar13;
          index = (CBlockIndex *)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
          auStack_280[0] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
          auStack_280[1] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
          auStack_280[2] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
          auStack_280[3] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
          auStack_280[4] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
          auStack_280[5] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
          auStack_280[6] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
          auStack_280[7] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
          auStack_280[8] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
          auStack_280[9] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
          auStack_280[10] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
          auStack_280[0xb] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
          auStack_280[0xc] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
          auStack_280[0xd] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
          auStack_280[0xe] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
          auStack_280[0xf] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
          auStack_280[0x10] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
          auStack_280[0x11] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
          auStack_280[0x12] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
          auStack_280[0x13] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
          auStack_280[0x14] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
          auStack_280[0x15] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
          auStack_280[0x16] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
          auStack_280[0x17] = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
          local_610[0]._24_4_ = ReadVarInt<AutoFile,(VarIntMode)0,unsigned_int>(coins_file);
          _obj = (RecursiveMutex *)&criticalblock55;
          local_780.m_object = (CScript *)&criticalblock55.super_unique_lock._M_owns;
          ActionUnserialize::
          SerReadWriteMany<AutoFile,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
                    (coins_file,(Wrapper<AmountCompression,_long_&> *)&obj,&local_780);
          if ((iVar5 < (int)((uint)local_610[0]._24_4_ >> 1)) || (local_268 == 0xffffffff)) {
            local_2e8 = local_2d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2e8,"Bad snapshot data after deserializing %d coins","");
            maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ =
                 (long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                        .super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&maybe_stats,local_2e8,local_2e0 + (long)local_2e8);
            puVar1 = (undefined1 *)
                     ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                             _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload
                     + 0x30);
            maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ = puVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                               _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                               _M_payload + 0x20),local_2e8,local_2e0 + (long)local_2e8);
            _obj = (RecursiveMutex *)(coins_count - coins_left);
            tinyformat::format<unsigned_long>
                      (&local_2c8,(bilingual_str *)&maybe_stats,(unsigned_long *)&obj);
            puVar17 = (undefined8 *)
                      ((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>
              .super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
            paVar3 = &local_2c8.original.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8.original._M_dataplus._M_p == paVar3) {
              *puVar17 = CONCAT71(local_2c8.original.field_2._M_allocated_capacity._1_7_,
                                  local_2c8.original.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                   local_2c8.original.field_2._8_8_;
            }
            else {
              *(pointer *)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate> =
                   local_2c8.original._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10)
                   = CONCAT71(local_2c8.original.field_2._M_allocated_capacity._1_7_,
                              local_2c8.original.field_2._M_local_buf[0]);
            }
            paVar4 = &local_2c8.translated.field_2;
            *(size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
                 local_2c8.original._M_string_length;
            local_2c8.original._M_string_length = 0;
            local_2c8.original.field_2._M_local_buf[0] = '\0';
            puVar17 = (undefined8 *)
                      ((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
            *(undefined8 **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8.translated._M_dataplus._M_p == paVar4) {
              *puVar17 = CONCAT71(local_2c8.translated.field_2._M_allocated_capacity._1_7_,
                                  local_2c8.translated.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                   local_2c8.translated.field_2._8_8_;
            }
            else {
              *(pointer *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                   local_2c8.translated._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30)
                   = CONCAT71(local_2c8.translated.field_2._M_allocated_capacity._1_7_,
                              local_2c8.translated.field_2._M_local_buf[0]);
            }
            *(size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
                 local_2c8.translated._M_string_length;
            local_2c8.translated._M_string_length = 0;
            local_2c8.translated.field_2._M_local_buf[0] = '\0';
            *(__index_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
            local_2c8.original._M_dataplus._M_p = (pointer)paVar3;
            local_2c8.translated._M_dataplus._M_p = (pointer)paVar4;
            if ((undefined1 *)
                maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ != puVar1) {
              operator_delete((void *)maybe_stats.
                                      super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                      _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                                      _M_payload._32_8_,
                              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                              _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                              _M_payload._M_value.nTransactionOutputs + 1);
            }
            if ((undefined1 *)
                maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ !=
                (undefined1 *)
                ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                        .super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10)) {
              operator_delete((void *)maybe_stats.
                                      super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                      _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                                      _M_payload._0_8_,
                              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                              _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                              _M_payload._16_8_ + 1);
            }
            plVar18 = local_2e8;
            if (local_2e8 != local_2d8) {
LAB_00405f65:
              operator_delete(plVar18,local_2d8[0] + 1);
            }
LAB_00405f6d:
            if (0x1c < (uint)local_610[0]._20_4_) {
              free((void *)criticalblock55.super_unique_lock._8_8_);
            }
            goto LAB_00405b8c;
          }
          if ((mutex_type *)0x775f05a074000 < criticalblock55.super_unique_lock._M_device) {
            local_348 = local_338;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_348,
                       "Bad snapshot data after deserializing %d coins - bad tx out value","");
            maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ =
                 (long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                        .super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&maybe_stats,local_348,local_340 + (long)local_348);
            puVar1 = (undefined1 *)
                     ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                             _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload
                     + 0x30);
            maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ = puVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                               _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                               _M_payload + 0x20),local_348,local_340 + (long)local_348);
            _obj = (RecursiveMutex *)(coins_count - coins_left);
            tinyformat::format<unsigned_long>
                      (&local_328,(bilingual_str *)&maybe_stats,(unsigned_long *)&obj);
            puVar17 = (undefined8 *)
                      ((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>
              .super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
            paVar3 = &local_328.original.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328.original._M_dataplus._M_p == paVar3) {
              *puVar17 = CONCAT71(local_328.original.field_2._M_allocated_capacity._1_7_,
                                  local_328.original.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                   local_328.original.field_2._8_8_;
            }
            else {
              *(pointer *)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate> =
                   local_328.original._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10)
                   = CONCAT71(local_328.original.field_2._M_allocated_capacity._1_7_,
                              local_328.original.field_2._M_local_buf[0]);
            }
            paVar4 = &local_328.translated.field_2;
            *(size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
                 local_328.original._M_string_length;
            local_328.original._M_string_length = 0;
            local_328.original.field_2._M_local_buf[0] = '\0';
            puVar17 = (undefined8 *)
                      ((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
            *(undefined8 **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328.translated._M_dataplus._M_p == paVar4) {
              *puVar17 = CONCAT71(local_328.translated.field_2._M_allocated_capacity._1_7_,
                                  local_328.translated.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                   local_328.translated.field_2._8_8_;
            }
            else {
              *(pointer *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                   local_328.translated._M_dataplus._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30)
                   = CONCAT71(local_328.translated.field_2._M_allocated_capacity._1_7_,
                              local_328.translated.field_2._M_local_buf[0]);
            }
            *(size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
                 local_328.translated._M_string_length;
            local_328.translated._M_string_length = 0;
            local_328.translated.field_2._M_local_buf[0] = '\0';
            *(__index_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
            local_328.original._M_dataplus._M_p = (pointer)paVar3;
            local_328.translated._M_dataplus._M_p = (pointer)paVar4;
            if ((undefined1 *)
                maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ != puVar1) {
              operator_delete((void *)maybe_stats.
                                      super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                      _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                                      _M_payload._32_8_,
                              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                              _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                              _M_payload._M_value.nTransactionOutputs + 1);
            }
            if ((undefined1 *)
                maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ !=
                (undefined1 *)
                ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                        .super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10)) {
              operator_delete((void *)maybe_stats.
                                      super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                      _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                                      _M_payload._0_8_,
                              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                              _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                              _M_payload._16_8_ + 1);
            }
            local_2d8[0] = local_338[0];
            plVar18 = local_348;
            if (local_348 != local_338) goto LAB_00405f65;
            goto LAB_00405f6d;
          }
          CCoinsViewCache::EmplaceCoinInternalDANGER
                    (this_00,(COutPoint *)&index,(Coin *)&criticalblock55);
          coins_left = coins_left - 1;
          coins_processed = coins_processed + 1;
          if ((coins_processed * 0x790fb65668c26139 + 0x218def416bd80U >> 6 |
              coins_processed * 0x790fb65668c26139 << 0x3a) < 0x10c6f7a0b5ed) {
            _obj = ((float)coins_processed * 100.0) / (float)coins_count;
            sVar14 = CCoinsViewCache::DynamicMemoryUsage(this_00);
            maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
            super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = sVar14 / 1000000;
            logging_function_00._M_str = "PopulateAndValidateSnapshot";
            logging_function_00._M_len = 0x1b;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_00._M_len = 0x5e;
            LogPrintFormatInternal<long,float,unsigned_long>
                      (logging_function_00,source_file_00,0x1713,ALL,Info,
                       (ConstevalFormatString<3U>)0x810173,&coins_processed,(float *)&obj,
                       (unsigned_long *)&maybe_stats);
          }
          __nbytes = (char *)0x8bcf64e5ec10;
          if ((coins_processed * -0x647d108541ac2b25 + 0x1179ec9cbd8200U >> 6 |
              coins_processed * -0x647d108541ac2b25 << 0x3a) < 0x8bcf64e5ec11) {
            bVar9 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
            if (bVar9) {
              local_3a8 = local_398;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3a8,"Aborting after an interrupt was requested","");
              local_388 = &local_378;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_388,local_3a8,local_3a0 + (long)local_3a8);
              local_368 = &local_358;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_368,local_3a8,local_3a0 + (long)local_3a8);
              puVar17 = (undefined8 *)
                        ((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
              if (local_388 == &local_378) {
                *puVar17 = CONCAT71(uStack_377,local_378);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                     uStack_370;
              }
              else {
                *(undefined1 **)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate> = local_388;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10
                          ) = CONCAT71(uStack_377,local_378);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_380;
              local_380 = 0;
              local_378 = 0;
              puVar17 = (undefined8 *)
                        ((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17
              ;
              if (local_368 == &local_358) {
                *puVar17 = CONCAT71(uStack_357,local_358);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                     uStack_350;
              }
              else {
                *(undefined1 **)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                     local_368;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30
                          ) = CONCAT71(uStack_357,local_358);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
                   local_360;
              local_360 = 0;
              local_358 = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
              local_2d8[0] = local_398[0];
              plVar18 = local_3a8;
              local_388 = &local_378;
              local_368 = &local_358;
              if (local_3a8 != local_398) goto LAB_00405f65;
              goto LAB_00405f6d;
            }
            _obj = &cs_main;
            local_770 = false;
            std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&obj);
            if (snapshot_chainstate->m_mempool == (CTxMemPool *)0x0) {
              sVar14 = 0;
            }
            else {
              sVar14 = (snapshot_chainstate->m_mempool->m_opts).max_size_bytes;
            }
            CVar10 = Chainstate::GetCoinsCacheSizeState
                               (snapshot_chainstate,snapshot_chainstate->m_coinstip_cache_size_bytes
                                ,sVar14);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&obj);
            if (LARGE < CVar10) {
              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
              super__Optional_payload_base<kernel::CCoinsStats>._M_payload._16_8_ = 0;
              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
              super__Optional_payload_base<kernel::CCoinsStats>._M_payload._24_8_ = 0;
              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
              super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = 0;
              maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
              super__Optional_payload_base<kernel::CCoinsStats>._M_payload._8_8_ = 0;
              bytes.m_size = 0x20;
              bytes.m_data = (uchar *)&maybe_stats;
              GetRandBytes(bytes);
              CCoinsViewCache::SetBestBlock(this_00,(uint256 *)&maybe_stats);
              FlushSnapshotToDisk(this_00,false);
            }
          }
          if (0x1c < (uint)local_610[0]._20_4_) {
            free((void *)criticalblock55.super_unique_lock._8_8_);
          }
        }
      }
      CCoinsViewCache::SetBestBlock(this_00,&base_blockhash);
      AutoFile::read(coins_file,(int)&obj,(void *)0x1,(size_t)__nbytes);
      local_468 = local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_468,"Bad snapshot - coins left over after deserializing %d coins",
                 "");
      maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ =
           (long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                  super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&maybe_stats,local_468,local_460 + (long)local_468);
      puVar1 = (undefined1 *)
               ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                       super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x30);
      maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                         _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload +
                 0x20),local_468,local_460 + (long)local_468);
      tinyformat::format<unsigned_long>(local_448,(bilingual_str *)&maybe_stats,&coins_count);
      puVar17 = (undefined8 *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
      paVar3 = &local_448[0].original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448[0].original._M_dataplus._M_p == paVar3) {
        *puVar17 = CONCAT71(local_448[0].original.field_2._M_allocated_capacity._1_7_,
                            local_448[0].original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
             local_448[0].original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> =
             local_448[0].original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
             CONCAT71(local_448[0].original.field_2._M_allocated_capacity._1_7_,
                      local_448[0].original.field_2._M_local_buf[0]);
      }
      paVar4 = &local_448[0].translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
           local_448[0].original._M_string_length;
      local_448[0].original._M_string_length = 0;
      local_448[0].original.field_2._M_local_buf[0] = '\0';
      puVar17 = (undefined8 *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448[0].translated._M_dataplus._M_p == paVar4) {
        *puVar17 = CONCAT71(local_448[0].translated.field_2._M_allocated_capacity._1_7_,
                            local_448[0].translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
             local_448[0].translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
             local_448[0].translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
             CONCAT71(local_448[0].translated.field_2._M_allocated_capacity._1_7_,
                      local_448[0].translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
           local_448[0].translated._M_string_length;
      local_448[0].translated._M_string_length = 0;
      local_448[0].translated.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
      local_448[0].original._M_dataplus._M_p = (pointer)paVar3;
      local_448[0].translated._M_dataplus._M_p = (pointer)paVar4;
      if ((undefined1 *)
          maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
          super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ != puVar1) {
        operator_delete((void *)maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                                _M_payload._32_8_,
                        maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                        .super__Optional_payload_base<kernel::CCoinsStats>._M_payload._M_value.
                        nTransactionOutputs + 1);
      }
      if ((undefined1 *)
          maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
          super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ !=
          (undefined1 *)
          ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                  super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10)) {
        operator_delete((void *)maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                                _M_payload.super__Optional_payload_base<kernel::CCoinsStats>.
                                _M_payload._0_8_,
                        maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload
                        .super__Optional_payload_base<kernel::CCoinsStats>._M_payload._16_8_ + 1);
      }
      local_a8[0] = local_458[0];
      plVar18 = local_468;
      if (local_468 == local_458) goto LAB_00405b8c;
    }
    else {
      local_1d0 = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,"Work does not exceed active chainstate","");
      local_1b0 = &local_1a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,local_1d0,local_1c8 + (long)local_1d0);
      local_190 = &local_180;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_1d0,local_1c8 + (long)local_1d0);
      puVar17 = (undefined8 *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
      if (local_1b0 == &local_1a0) {
        *puVar17 = CONCAT71(uStack_19f,local_1a0);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) = uStack_198;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = local_1b0;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
             CONCAT71(uStack_19f,local_1a0);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_1a8;
      local_1a8 = 0;
      local_1a0 = 0;
      puVar17 = (undefined8 *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17;
      if (local_190 == &local_180) {
        *puVar17 = CONCAT71(uStack_17f,local_180);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) = uStack_178;
      }
      else {
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_190;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
             CONCAT71(uStack_17f,local_180);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_188;
      local_188 = 0;
      local_180 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
      local_a8[0] = local_1c0[0];
      plVar18 = local_1d0;
      local_1b0 = &local_1a0;
      local_190 = &local_180;
      if (local_1d0 == local_1c0) goto LAB_00405b8c;
    }
  }
  goto LAB_00405b84;
code_r0x00404ec9:
  pAVar16 = pAVar16 + 1;
  goto LAB_00404ebb;
LAB_00404ecf:
  local_c0 = 0;
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,
             "Assumeutxo height in snapshot metadata not recognized (%d) - refusing to load snapshot"
             ,"");
  puVar1 = (undefined1 *)
           ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                   super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x10);
  maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&maybe_stats,local_170,local_168 + (long)local_170);
  puVar2 = (undefined1 *)
           ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                   super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x30);
  maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ = puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             ((long)&maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                     super__Optional_payload_base<kernel::CCoinsStats>._M_payload + 0x20),local_170,
             local_168 + (long)local_170);
  tinyformat::format<int>(&local_150,(bilingual_str *)&maybe_stats,&base_height);
  puVar17 = (undefined8 *)
            ((long)&(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar17;
  paVar3 = &local_150.original.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.original._M_dataplus._M_p == paVar3) {
    *puVar17 = CONCAT71(local_150.original.field_2._M_allocated_capacity._1_7_,
                        local_150.original.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
         local_150.original.field_2._8_8_;
  }
  else {
    *(pointer *)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> =
         local_150.original._M_dataplus._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
         CONCAT71(local_150.original.field_2._M_allocated_capacity._1_7_,
                  local_150.original.field_2._M_local_buf[0]);
  }
  paVar4 = &local_150.translated.field_2;
  *(size_type *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
           super__Move_assign_alias<bilingual_str,_std::monostate>.
           super__Copy_assign_alias<bilingual_str,_std::monostate>.
           super__Move_ctor_alias<bilingual_str,_std::monostate>.
           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
           super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
       local_150.original._M_string_length;
  local_150.original._M_string_length = 0;
  local_150.original.field_2._M_local_buf[0] = '\0';
  puVar17 = (undefined8 *)
            ((long)&(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
  *(undefined8 **)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
           super__Move_assign_alias<bilingual_str,_std::monostate>.
           super__Copy_assign_alias<bilingual_str,_std::monostate>.
           super__Move_ctor_alias<bilingual_str,_std::monostate>.
           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
           super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.translated._M_dataplus._M_p == paVar4) {
    *puVar17 = CONCAT71(local_150.translated.field_2._M_allocated_capacity._1_7_,
                        local_150.translated.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
         local_150.translated.field_2._8_8_;
  }
  else {
    *(pointer *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
         local_150.translated._M_dataplus._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
         CONCAT71(local_150.translated.field_2._M_allocated_capacity._1_7_,
                  local_150.translated.field_2._M_local_buf[0]);
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
           super__Move_assign_alias<bilingual_str,_std::monostate>.
           super__Copy_assign_alias<bilingual_str,_std::monostate>.
           super__Move_ctor_alias<bilingual_str,_std::monostate>.
           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
           super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
       local_150.translated._M_string_length;
  local_150.translated._M_string_length = 0;
  local_150.translated.field_2._M_local_buf[0] = '\0';
  *(__index_type *)
   ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
           super__Move_assign_alias<bilingual_str,_std::monostate>.
           super__Copy_assign_alias<bilingual_str,_std::monostate>.
           super__Move_ctor_alias<bilingual_str,_std::monostate>.
           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
           super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
  local_150.original._M_dataplus._M_p = (pointer)paVar3;
  local_150.translated._M_dataplus._M_p = (pointer)paVar4;
  if ((undefined1 *)
      maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._32_8_ != puVar2) {
    operator_delete((void *)maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _32_8_,
                    maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                    super__Optional_payload_base<kernel::CCoinsStats>._M_payload._M_value.
                    nTransactionOutputs + 1);
  }
  if ((undefined1 *)
      maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
      super__Optional_payload_base<kernel::CCoinsStats>._M_payload._0_8_ != puVar1) {
    operator_delete((void *)maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>.
                            _M_payload.super__Optional_payload_base<kernel::CCoinsStats>._M_payload.
                            _0_8_,
                    maybe_stats.super__Optional_base<kernel::CCoinsStats,_true,_true>._M_payload.
                    super__Optional_payload_base<kernel::CCoinsStats>._M_payload._16_8_ + 1);
  }
  local_a8[0] = local_160[0];
  plVar18 = local_170;
  if (local_170 == local_160) goto LAB_00405b8c;
LAB_00405b84:
  operator_delete(plVar18,local_a8[0] + 1);
LAB_00405b8c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<void> ChainstateManager::PopulateAndValidateSnapshot(
    Chainstate& snapshot_chainstate,
    AutoFile& coins_file,
    const SnapshotMetadata& metadata)
{
    // It's okay to release cs_main before we're done using `coins_cache` because we know
    // that nothing else will be referencing the newly created snapshot_chainstate yet.
    CCoinsViewCache& coins_cache = *WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsTip());

    uint256 base_blockhash = metadata.m_base_blockhash;

    CBlockIndex* snapshot_start_block = WITH_LOCK(::cs_main, return m_blockman.LookupBlockIndex(base_blockhash));

    if (!snapshot_start_block) {
        // Needed for ComputeUTXOStats to determine the
        // height and to avoid a crash when base_blockhash.IsNull()
        return util::Error{strprintf(Untranslated("Did not find snapshot start blockheader %s"),
                  base_blockhash.ToString())};
    }

    int base_height = snapshot_start_block->nHeight;
    const auto& maybe_au_data = GetParams().AssumeutxoForHeight(base_height);

    if (!maybe_au_data) {
        return util::Error{strprintf(Untranslated("Assumeutxo height in snapshot metadata not recognized "
                  "(%d) - refusing to load snapshot"), base_height)};
    }

    const AssumeutxoData& au_data = *maybe_au_data;

    // This work comparison is a duplicate check with the one performed later in
    // ActivateSnapshot(), but is done so that we avoid doing the long work of staging
    // a snapshot that isn't actually usable.
    if (WITH_LOCK(::cs_main, return !CBlockIndexWorkComparator()(ActiveTip(), snapshot_start_block))) {
        return util::Error{Untranslated("Work does not exceed active chainstate")};
    }

    const uint64_t coins_count = metadata.m_coins_count;
    uint64_t coins_left = metadata.m_coins_count;

    LogPrintf("[snapshot] loading %d coins from snapshot %s\n", coins_left, base_blockhash.ToString());
    int64_t coins_processed{0};

    while (coins_left > 0) {
        try {
            Txid txid;
            coins_file >> txid;
            size_t coins_per_txid{0};
            coins_per_txid = ReadCompactSize(coins_file);

            if (coins_per_txid > coins_left) {
                return util::Error{Untranslated("Mismatch in coins count in snapshot metadata and actual snapshot data")};
            }

            for (size_t i = 0; i < coins_per_txid; i++) {
                COutPoint outpoint;
                Coin coin;
                outpoint.n = static_cast<uint32_t>(ReadCompactSize(coins_file));
                outpoint.hash = txid;
                coins_file >> coin;
                if (coin.nHeight > base_height ||
                    outpoint.n >= std::numeric_limits<decltype(outpoint.n)>::max() // Avoid integer wrap-around in coinstats.cpp:ApplyHash
                ) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins"),
                              coins_count - coins_left)};
                }
                if (!MoneyRange(coin.out.nValue)) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins - bad tx out value"),
                              coins_count - coins_left)};
                }
                coins_cache.EmplaceCoinInternalDANGER(std::move(outpoint), std::move(coin));

                --coins_left;
                ++coins_processed;

                if (coins_processed % 1000000 == 0) {
                    LogPrintf("[snapshot] %d coins loaded (%.2f%%, %.2f MB)\n",
                        coins_processed,
                        static_cast<float>(coins_processed) * 100 / static_cast<float>(coins_count),
                        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
                }

                // Batch write and flush (if we need to) every so often.
                //
                // If our average Coin size is roughly 41 bytes, checking every 120,000 coins
                // means <5MB of memory imprecision.
                if (coins_processed % 120000 == 0) {
                    if (m_interrupt) {
                        return util::Error{Untranslated("Aborting after an interrupt was requested")};
                    }

                    const auto snapshot_cache_state = WITH_LOCK(::cs_main,
                        return snapshot_chainstate.GetCoinsCacheSizeState());

                    if (snapshot_cache_state >= CoinsCacheSizeState::CRITICAL) {
                        // This is a hack - we don't know what the actual best block is, but that
                        // doesn't matter for the purposes of flushing the cache here. We'll set this
                        // to its correct value (`base_blockhash`) below after the coins are loaded.
                        coins_cache.SetBestBlock(GetRandHash());

                        // No need to acquire cs_main since this chainstate isn't being used yet.
                        FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/false);
                    }
                }
            }
        } catch (const std::ios_base::failure&) {
            return util::Error{strprintf(Untranslated("Bad snapshot format or truncated snapshot after deserializing %d coins"),
                      coins_processed)};
        }
    }

    // Important that we set this. This and the coins_cache accesses above are
    // sort of a layer violation, but either we reach into the innards of
    // CCoinsViewCache here or we have to invert some of the Chainstate to
    // embed them in a snapshot-activation-specific CCoinsViewCache bulk load
    // method.
    coins_cache.SetBestBlock(base_blockhash);

    bool out_of_coins{false};
    try {
        std::byte left_over_byte;
        coins_file >> left_over_byte;
    } catch (const std::ios_base::failure&) {
        // We expect an exception since we should be out of coins.
        out_of_coins = true;
    }
    if (!out_of_coins) {
        return util::Error{strprintf(Untranslated("Bad snapshot - coins left over after deserializing %d coins"),
            coins_count)};
    }

    LogPrintf("[snapshot] loaded %d (%.2f MB) coins from snapshot %s\n",
        coins_count,
        coins_cache.DynamicMemoryUsage() / (1000 * 1000),
        base_blockhash.ToString());

    // No need to acquire cs_main since this chainstate isn't being used yet.
    FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/true);

    assert(coins_cache.GetBestBlock() == base_blockhash);

    // As above, okay to immediately release cs_main here since no other context knows
    // about the snapshot_chainstate.
    CCoinsViewDB* snapshot_coinsdb = WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsDB());

    std::optional<CCoinsStats> maybe_stats;

    try {
        maybe_stats = ComputeUTXOStats(
            CoinStatsHashType::HASH_SERIALIZED, snapshot_coinsdb, m_blockman, [&interrupt = m_interrupt] { SnapshotUTXOHashBreakpoint(interrupt); });
    } catch (StopHashingException const&) {
        return util::Error{Untranslated("Aborting after an interrupt was requested")};
    }
    if (!maybe_stats.has_value()) {
        return util::Error{Untranslated("Failed to generate coins stats")};
    }

    // Assert that the deserialized chainstate contents match the expected assumeutxo value.
    if (AssumeutxoHash{maybe_stats->hashSerialized} != au_data.hash_serialized) {
        return util::Error{strprintf(Untranslated("Bad snapshot content hash: expected %s, got %s"),
            au_data.hash_serialized.ToString(), maybe_stats->hashSerialized.ToString())};
    }

    snapshot_chainstate.m_chain.SetTip(*snapshot_start_block);

    // The remainder of this function requires modifying data protected by cs_main.
    LOCK(::cs_main);

    // Fake various pieces of CBlockIndex state:
    CBlockIndex* index = nullptr;

    // Don't make any modifications to the genesis block since it shouldn't be
    // necessary, and since the genesis block doesn't have normal flags like
    // BLOCK_VALID_SCRIPTS set.
    constexpr int AFTER_GENESIS_START{1};

    for (int i = AFTER_GENESIS_START; i <= snapshot_chainstate.m_chain.Height(); ++i) {
        index = snapshot_chainstate.m_chain[i];

        // Fake BLOCK_OPT_WITNESS so that Chainstate::NeedsRedownload()
        // won't ask for -reindex on startup.
        if (DeploymentActiveAt(*index, *this, Consensus::DEPLOYMENT_SEGWIT)) {
            index->nStatus |= BLOCK_OPT_WITNESS;
        }

        m_blockman.m_dirty_blockindex.insert(index);
        // Changes to the block index will be flushed to disk after this call
        // returns in `ActivateSnapshot()`, when `MaybeRebalanceCaches()` is
        // called, since we've added a snapshot chainstate and therefore will
        // have to downsize the IBD chainstate, which will result in a call to
        // `FlushStateToDisk(ALWAYS)`.
    }

    assert(index);
    assert(index == snapshot_start_block);
    index->m_chain_tx_count = au_data.m_chain_tx_count;
    snapshot_chainstate.setBlockIndexCandidates.insert(snapshot_start_block);

    LogPrintf("[snapshot] validated snapshot (%.2f MB)\n",
        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
    return {};
}